

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

bool __thiscall flow::lang::Lexer::ipv6HexDigit4(Lexer *this)

{
  bool bVar1;
  int iVar2;
  bool local_21;
  ulong local_18;
  size_t i;
  Lexer *this_local;
  
  local_18 = this->ipv6HexDigits_;
  while (bVar1 = isHexChar(this), bVar1) {
    iVar2 = currentChar(this);
    std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
    nextChar(this,true);
    local_18 = local_18 + 1;
  }
  this->ipv6HexDigits_ = 0;
  local_21 = local_18 != 0 && local_18 < 5;
  return local_21;
}

Assistant:

bool Lexer::ipv6HexDigit4() {
  size_t i = ipv6HexDigits_;

  while (isHexChar()) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
    ++i;
  }

  ipv6HexDigits_ = 0;

  return i >= 1 && i <= 4;
}